

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int main(int argc,char **argv)

{
  service *psVar1;
  __pid_t _Var2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_EAX;
  time_t tVar7;
  int *piVar8;
  service *psVar9;
  time_t tVar10;
  long lVar11;
  char *fmt;
  socketinfo *psVar12;
  listnode *plVar13;
  listnode *plVar14;
  undefined8 uStack_310;
  int s [2];
  int status;
  service *local_2f0;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  pollfd ufds [4];
  char tmp [92];
  sigaction act;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  
  uStack_310 = (code *)0x1057ef;
  _Var2 = fork();
  if (_Var2 == 0) {
    uStack_310 = (code *)0x1058d8;
    bootchart_count = bootchart_init();
    if (0 < bootchart_count) {
      uStack_310 = (code *)0x1058fd;
      log_write(5,"<5>init: bootcharting started (period=%d ms)\n",
                (ulong)(uint)(bootchart_count * 200));
      while (0 < bootchart_count) {
        uStack_310 = (code *)0x10590f;
        iVar3 = bootchart_step();
        if (iVar3 < 0) break;
        bootchart_count = bootchart_count + -1;
        uStack_310 = (code *)0x105927;
        usleep(200000);
      }
      uStack_310 = (code *)0x10599f;
      bootchart_finish();
      return 0;
    }
    if (-1 < bootchart_count) {
      fmt = "<5>init: bootcharting ignored\n";
      iVar3 = 0;
      iVar5 = 5;
      goto LAB_00105a38;
    }
    fmt = "<3>init: bootcharting init failure\n";
    iVar3 = 0;
  }
  else {
    act.__sigaction_handler.sa_handler = sigchld_handler;
    act.sa_flags = 1;
    act.sa_restorer = (_func_void *)0x0;
    uStack_310 = (code *)0x105821;
    sigemptyset((sigset_t *)&act.sa_mask);
    uStack_310 = (code *)0x105833;
    sigaction(0x11,(sigaction *)&act,(sigaction *)0x0);
    uStack_310 = (code *)0x10583a;
    umask(0);
    uStack_310 = (code *)0x10583f;
    log_init();
    uStack_310 = (code *)0x105852;
    log_write(6,"<6>init: reading config file\n");
    uStack_310 = (code *)0x10585e;
    parse_config_file("/platform//init.rc");
    uStack_310 = (code *)0x105865;
    import_kernel_cmdline(0);
    uStack_310 = (code *)0x105878;
    action_for_each_trigger("early-init",action_add_queue_tail);
    uStack_310 = (code *)0x10587d;
    drain_action_queue();
    uStack_310 = (code *)0x10588d;
    log_write(6,"<6>init: device init\n");
    uStack_310 = (code *)0x105892;
    property_init();
    if (console[0] != '\0') {
      uStack_310 = (code *)0x1058bf;
      snprintf(tmp,0x5c,"/dev/%s",console);
      uStack_310 = (code *)0x1058c7;
      console_name = strdup(tmp);
    }
    uStack_310 = (code *)0x10593a;
    iVar3 = open(console_name,2);
    if (-1 < iVar3) {
      have_console = 1;
    }
    uStack_310 = (code *)0x10594c;
    close(iVar3);
    if (qemu[0] != '\0') {
      uStack_310 = (code *)0x10595d;
      import_kernel_cmdline(1);
    }
    uStack_310 = (code *)0x105970;
    action_for_each_trigger("init",action_add_queue_tail);
    uStack_310 = (code *)0x105975;
    drain_action_queue();
    uStack_310 = (code *)0x10597a;
    uVar4 = start_property_service();
    iVar3 = 1;
    uStack_310 = (code *)0x105990;
    iVar5 = socketpair(1,1,0,s);
    uVar6 = s[1];
    if (iVar5 == 0) {
      signal_fd = s[0];
      uStack_310 = (code *)0x1059c8;
      fcntl(s[0],2,1);
      uStack_310 = (code *)0x1059df;
      fcntl(s[0],4,0x800);
      uStack_310 = (code *)0x1059ef;
      fcntl(s[1],2,1);
      uStack_310 = (code *)0x105a02;
      fcntl(s[1],4,0x800);
    }
    else {
      uVar6 = 0xffffffff;
    }
    uStack_310 = (code *)0x105a16;
    mkfifo("/dev/initctl",0x180);
    uStack_310 = (code *)0x105a25;
    local_2e0 = open("/dev/initctl",0x800);
    if (-1 < (int)(local_2e0 | uVar4 | uVar6)) {
      uStack_310 = (code *)0x105a76;
      umask(0x12);
      uStack_310 = (code *)0x105a8c;
      action_for_each_trigger("early-boot",action_add_queue_tail);
      uStack_310 = (code *)0x105a9b;
      action_for_each_trigger("boot",action_add_queue_tail);
      uStack_310 = (code *)0x105aa0;
      drain_action_queue();
      uStack_310 = (code *)0x105ab1;
      log_write(3,"<3>init: DONE\n");
      ufds[0].events = 1;
      ufds[1].events = 1;
      ufds[2].events = 1;
      ufds[3].events = 0;
      ufds[3].revents = 0;
      lVar11 = 0;
      local_2e4 = uVar4;
      local_2dc = uVar6;
      ufds[0].fd = local_2e0;
      ufds[1].fd = uVar4;
      ufds[2].fd = uVar6;
      do {
        while( true ) {
          do {
            for (; lVar11 != 3; lVar11 = lVar11 + 1) {
              ufds[lVar11].revents = 0;
            }
            uStack_310 = (code *)0x105b07;
            drain_action_queue();
            process_needs_restart = 0;
            uStack_310 = (code *)0x105b1e;
            service_for_each_flags(8,restart_service_if_needed);
            tVar10 = process_needs_restart;
            iVar3 = -1;
            if (process_needs_restart != 0) {
              uStack_310 = (code *)0x105b31;
              tVar7 = gettime();
              iVar3 = ((int)tVar10 - (int)tVar7) * 1000;
              if (iVar3 < 1) {
                iVar3 = 0;
              }
            }
            uStack_310 = (code *)0x105b52;
            iVar3 = poll((pollfd *)ufds,3,iVar3);
            lVar11 = 0;
          } while (iVar3 < 1);
          if (ufds[2].revents == 1) break;
          if (ufds[0].revents == 1) {
            uStack_310 = (code *)0x105d75;
            log_write(6,"<6>init: %d %c");
            uStack_310 = (code *)0x105d86;
            read(local_2e0,&local_1b8,0x180);
            if ((local_1b8 == 0x3091969) && (local_1b4 == 1)) {
              iVar3 = (uint)(local_1b0 != 0x30) * 3 + 0xc;
              uStack_310 = sigchld_handler;
              init_reboot(iVar3);
              uStack_310 = (code *)CONCAT44(iVar3,extraout_EAX);
              write(signal_fd,(void *)((long)&uStack_310 + 4),1);
              return (int)uStack_310;
            }
          }
          lVar11 = 0;
          if (ufds[1].revents == 1) {
            uStack_310 = (code *)0x105db7;
            handle_property_set_fd(local_2e4);
            lVar11 = 0;
          }
        }
        uStack_310 = (code *)0x105b77;
        read(uVar6,tmp,0x5c);
        do {
          while( true ) {
            uStack_310 = (code *)0x105b84;
            uVar6 = waitpid(-1,&status,1);
            if (uVar6 == 0xffffffff) break;
            if ((int)uVar6 < 1) goto LAB_00105dbe;
            uStack_310 = (code *)0x105bbb;
            log_write(6,"<6>init: waitpid returned pid %d, status = %08x\n",(ulong)uVar6);
            uStack_310 = (code *)0x105bc3;
            psVar9 = service_find_by_pid(uVar6);
            if (psVar9 == (service *)0x0) {
              uStack_310 = (code *)0x105cb6;
              log_write(3,"<3>init: untracked pid %d exited\n",(ulong)uVar6);
            }
            else {
              uStack_310 = (code *)0x105be7;
              log_write(5,"<5>init: process \'%s\', pid %d exited\n",psVar9->name,(ulong)uVar6);
              local_2f0 = psVar9;
              if ((psVar9->flags & 2) == 0) {
                uStack_310 = (code *)0x105c01;
                kill(-uVar6,9);
                uStack_310 = (code *)0x105c1b;
                log_write(5,"<5>init: process \'%s\' killing any children in process group\n",
                          local_2f0->name);
              }
              psVar12 = (socketinfo *)&psVar9->sockets;
              while (psVar1 = local_2f0, psVar12 = psVar12->next, psVar12 != (socketinfo *)0x0) {
                uStack_310 = (code *)0x105c47;
                snprintf((char *)&local_1b8,0x80,"/dev/socket/%s",psVar12->name);
                uStack_310 = (code *)0x105c4f;
                unlink((char *)&local_1b8);
              }
              local_2f0->pid = 0;
              uVar6 = local_2f0->flags;
              uVar4 = uVar6 >> 1 & 1;
              local_2f0->flags = uVar4 | uVar6 & 0xfffffffb;
              if (uVar4 == 0 && (uVar6 & 1) == 0) {
                uStack_310 = (code *)0x105c78;
                tVar10 = gettime();
                if ((psVar1->flags & 0x20) != 0) {
                  if (psVar1->time_crashed + 0xf0 < tVar10) {
                    psVar1->time_crashed = tVar10;
                    psVar1->nr_crashed = 1;
                  }
                  else {
                    iVar3 = psVar1->nr_crashed;
                    psVar1->nr_crashed = iVar3 + 1;
                    if (3 < iVar3) {
                      uStack_310 = (code *)0x105cfb;
                      log_write(3,
                                "<3>init: critical process \'%s\' exited %d times in %d minutes; rebooting into recovery mode\n"
                                ,psVar1->name,4,4);
                      uStack_310 = (code *)0x105d00;
                      sync();
                      uStack_310 = (code *)&UNK_00105d0a;
                      reboot(0x1234567);
                    }
                  }
                }
                plVar14 = &(psVar9->onrestart).commands;
                plVar13 = plVar14;
                while (plVar13 = plVar13->next, plVar13 != plVar14) {
                  uStack_310 = (code *)0x105d2e;
                  (*(code *)plVar13[1].next)(*(undefined4 *)&plVar13[1].prev,plVar13 + 2);
                }
                *(byte *)&local_2f0->flags = (byte)local_2f0->flags | 8;
                uStack_310 = (code *)0x105d49;
                notify_service_state(local_2f0->name,"restarting");
              }
              else {
                uStack_310 = (code *)0x105ccb;
                notify_service_state(local_2f0->name,"stopped");
              }
            }
          }
          uStack_310 = (code *)0x105b8e;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
LAB_00105dbe:
        lVar11 = 0;
        uVar6 = local_2dc;
      } while( true );
    }
    fmt = "<3>init: init startup failure\n";
  }
  iVar5 = 3;
LAB_00105a38:
  uStack_310 = (code *)0x105a40;
  log_write(iVar5,fmt);
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    int init_fd = -1;
    int property_set_fd = -1;
    int signal_recv_fd = -1;
    int fd, fd_count, s[2];
    struct sigaction act;
    char tmp[PROP_NAME_MAX];
    struct pollfd ufds[4];
    pid_t pid;

    //mount("tmpfs", "/tmp", "tmpfs", MS_NODEV|MS_NOSUID, "mode=1777");
    //mount("proc", "/proc", "proc", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);
    //mount("sysfs", "/sys", "sysfs", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);

#if BOOTCHART
    pid = fork();
    if (!pid) { /* child process */
        bootchart_count = bootchart_init();
        if (bootchart_count > 0) {
            NOTICE("bootcharting started (period=%d ms)\n", bootchart_count*BOOTCHART_POLLING_MS);
        } else if (bootchart_count < 0) {
            ERROR("bootcharting init failure\n");
            return 0;
        } else {
            NOTICE("bootcharting ignored\n");
            return 0;
        }

        while (bootchart_count > 0) {
            if (bootchart_step() < 0)
                break;
            --bootchart_count;
            usleep(BOOTCHART_POLLING_MS*1000);
        }
        bootchart_finish();
        return 0;
    }
#endif

    act.sa_handler = sigchld_handler;
    act.sa_flags = SA_NOCLDSTOP;
    act.sa_restorer = NULL;
    sigemptyset(&act.sa_mask);
    sigaction(SIGCHLD, &act, 0);

    /* clear the umask */
    umask(0);

        /* We must have some place other than / to create the
         * device nodes for kmsg and null, otherwise we won't
         * be able to remount / read-only later on.
         * Now that tmpfs is mounted on /dev, we can actually
         * talk to the outside world.
         */
//    open_devnull_stdio();
    log_init();
    
    INFO("reading config file\n");
    parse_config_file(INITRC_FILE_PATH);

    /* pull the kernel commandline and ramdisk properties file in */
    import_kernel_cmdline(0);

    action_for_each_trigger("early-init", action_add_queue_tail);
    drain_action_queue();

    INFO("device init\n");

    property_init();

    if (console[0]) {
        snprintf(tmp, sizeof(tmp), "/dev/%s", console);
        console_name = strdup(tmp);
    }

    fd = open(console_name, O_RDWR);
    if (fd >= 0)
        have_console = 1;
    close(fd);

    if (qemu[0])
        import_kernel_cmdline(1); 
   
        /* execute all the boot actions to get us started */
    action_for_each_trigger("init", action_add_queue_tail);
    drain_action_queue();

        /* read any property files on system or data and
         * fire up the property service.  This must happen
         * after the ro.foo properties are set above so
         * that /data/local.prop cannot interfere with them.
         */
    property_set_fd = start_property_service();

    /* create a signalling mechanism for the sigchld handler */
    if (socketpair(AF_UNIX, SOCK_STREAM, 0, s) == 0) {
        signal_fd = s[0];
        signal_recv_fd = s[1];
        fcntl(s[0], F_SETFD, FD_CLOEXEC);
        fcntl(s[0], F_SETFL, O_NONBLOCK);
        fcntl(s[1], F_SETFD, FD_CLOEXEC);
        fcntl(s[1], F_SETFL, O_NONBLOCK);
    }

    mkfifo("/dev/initctl", 0600);
    init_fd = open("/dev/initctl", O_RDONLY|O_NONBLOCK);
    /* make sure we actually have all the pieces we need */
    if((init_fd < 0) ||
        (property_set_fd < 0) ||
        (signal_recv_fd < 0)) {
        ERROR("init startup failure\n");
        return 1;
    }
    umask(0022);

    /* execute all the boot actions to get us started */
    action_for_each_trigger("early-boot", action_add_queue_tail);
    action_for_each_trigger("boot", action_add_queue_tail);
    drain_action_queue();
    ERROR("DONE\n");

    ufds[0].fd = init_fd;
    ufds[0].events = POLLIN;
    ufds[1].fd = property_set_fd;
    ufds[1].events = POLLIN;
    ufds[2].fd = signal_recv_fd;
    ufds[2].events = POLLIN;
    fd_count = 3;

    ufds[3].events = 0;
    ufds[3].revents = 0;

    for(;;) {
        int nr, i, timeout = -1;

        for (i = 0; i < fd_count; i++)
            ufds[i].revents = 0;

        drain_action_queue();
        restart_processes();

        if (process_needs_restart) {
            timeout = (process_needs_restart - gettime()) * 1000;
            if (timeout < 0)
                timeout = 0;
        }

        nr = poll(ufds, fd_count, timeout);
        if (nr <= 0)
            continue;

        if (ufds[2].revents == POLLIN) {
            /* we got a SIGCHLD - reap and restart as needed */
            read(signal_recv_fd, tmp, sizeof(tmp));
            while (!wait_for_one_process(0))
                ;
            continue;
        }

        if (ufds[0].revents == POLLIN)
            handle_init_fd(init_fd);
        if (ufds[1].revents == POLLIN)
            handle_property_set_fd(property_set_fd);
    }

    return 0;
}